

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

LY_ERR lyd_diff_reverse_meta(lyd_node *node,lys_module *mod,char *name1,char *name2)

{
  LY_ERR LVar1;
  lyd_meta *meta;
  lyd_meta *meta_00;
  char *val_str;
  char *pcVar2;
  ly_ctx *ctx;
  lys_module *plVar3;
  
  meta = lyd_find_meta(node->meta,mod,name1);
  if (meta == (lyd_meta *)0x0) {
    pcVar2 = lyd_path(node,LYD_PATH_STD,(char *)0x0,0);
    if (node->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&node[2].schema;
    }
    else {
      plVar3 = node->schema->module;
    }
    ctx = plVar3->ctx;
    name2 = name1;
  }
  else {
    meta_00 = lyd_find_meta(node->meta,mod,name2);
    if (meta_00 != (lyd_meta *)0x0) {
      val_str = (meta->value)._canonical;
      if (val_str == (char *)0x0) {
        val_str = lyd_value_get_canonical(meta->annotation->module->ctx,&meta->value);
      }
      pcVar2 = (meta_00->value)._canonical;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = lyd_value_get_canonical(meta_00->annotation->module->ctx,&meta_00->value);
      }
      pcVar2 = strdup(pcVar2);
      LVar1 = lyd_change_meta(meta,pcVar2);
      if (LVar1 == LY_SUCCESS) {
        LVar1 = lyd_change_meta(meta_00,val_str);
      }
      goto LAB_00118406;
    }
    pcVar2 = lyd_path(node,LYD_PATH_STD,(char *)0x0,0);
    if (node->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&node[2].schema;
    }
    else {
      plVar3 = node->schema->module;
    }
    ctx = plVar3->ctx;
  }
  LVar1 = LY_EINVAL;
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",name2,pcVar2);
LAB_00118406:
  free(pcVar2);
  return LVar1;
}

Assistant:

static LY_ERR
lyd_diff_reverse_meta(struct lyd_node *node, const struct lys_module *mod, const char *name1, const char *name2)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_meta *meta1, *meta2;
    const char *val1 = NULL;
    char *val2 = NULL;

    meta1 = lyd_find_meta(node->meta, mod, name1);
    LY_CHECK_ERR_RET(!meta1, LOGERR_META(LYD_CTX(node), name1, node), LY_EINVAL);

    meta2 = lyd_find_meta(node->meta, mod, name2);
    LY_CHECK_ERR_RET(!meta2, LOGERR_META(LYD_CTX(node), name2, node), LY_EINVAL);

    /* value1 */
    val1 = lyd_get_meta_value(meta1);

    /* value2 */
    val2 = strdup(lyd_get_meta_value(meta2));

    /* switch values */
    LY_CHECK_GOTO(ret = lyd_change_meta(meta1, val2), cleanup);
    LY_CHECK_GOTO(ret = lyd_change_meta(meta2, val1), cleanup);

cleanup:
    free(val2);
    return ret;
}